

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIListBox::recalculateItemWidth(CGUIListBox *this,s32 icon)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar3;
  long lVar4;
  
  if (-1 < icon && this->IconBank != (IGUISpriteBank *)0x0) {
    iVar2 = (*this->IconBank->_vptr_IGUISpriteBank[1])();
    if ((uint)icon <
        (uint)((int)((ulong)(((long *)CONCAT44(extraout_var,iVar2))[1] -
                            *(long *)CONCAT44(extraout_var,iVar2)) >> 3) * -0x33333333)) {
      iVar2 = (*this->IconBank->_vptr_IGUISpriteBank[1])();
      uVar3 = (ulong)(uint)icon;
      if ((int)((ulong)(*(long *)(*(long *)CONCAT44(extraout_var_00,iVar2) + 8 + uVar3 * 0x28) -
                       *(long *)(*(long *)CONCAT44(extraout_var_00,iVar2) + uVar3 * 0x28)) >> 3) !=
          0) {
        iVar2 = (*this->IconBank->_vptr_IGUISpriteBank[1])();
        uVar1 = *(uint *)(*(long *)(*(long *)CONCAT44(extraout_var_01,iVar2) + uVar3 * 0x28) + 4);
        iVar2 = (**this->IconBank->_vptr_IGUISpriteBank)();
        if (uVar1 < (uint)((ulong)(((long *)CONCAT44(extraout_var_02,iVar2))[1] -
                                  *(long *)CONCAT44(extraout_var_02,iVar2)) >> 4)) {
          iVar2 = (**this->IconBank->_vptr_IGUISpriteBank)();
          lVar4 = (ulong)uVar1 * 0x10;
          iVar2 = *(int *)(*(long *)CONCAT44(extraout_var_03,iVar2) + 8 + lVar4) -
                  *(int *)(*(long *)CONCAT44(extraout_var_03,iVar2) + lVar4);
          if (this->ItemsIconWidth < iVar2) {
            this->ItemsIconWidth = iVar2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CGUIListBox::recalculateItemWidth(s32 icon)
{
	if (IconBank && icon > -1 &&
			IconBank->getSprites().size() > (u32)icon &&
			IconBank->getSprites()[(u32)icon].Frames.size()) {
		u32 rno = IconBank->getSprites()[(u32)icon].Frames[0].rectNumber;
		if (IconBank->getPositions().size() > rno) {
			const s32 w = IconBank->getPositions()[rno].getWidth();
			if (w > ItemsIconWidth)
				ItemsIconWidth = w;
		}
	}
}